

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::
MatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::MatrixCompMult>::addCase<2,2>
          (MatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::MatrixCompMult> *this,
          Context *ctx,TestCaseGroup *group)

{
  char *__s;
  Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *func;
  PrecisionCase *node;
  allocator<char> local_39;
  string local_38;
  
  __s = glu::getDataTypeName(TYPE_FLOAT_MAT2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  func = (Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *)instance<deqp::gls::BuiltinPrecisionTests::Functions::MatrixCompMult<2,2>>();
  node = createFuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,2,2>,tcu::Matrix<float,2,2>,tcu::Matrix<float,2,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
                   (ctx,&local_38,func);
  tcu::TestNode::addChild(&group->super_TestNode,(TestNode *)node);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void				addCase			(const Context& ctx, TestCaseGroup* group) const
	{
		const char*	const name = dataTypeNameOf<Matrix<float, Rows, Cols> >();

		group->addChild(createFuncCase(ctx, name, instance<GenF<Rows, Cols> >()));
	}